

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_distFcnElement.cpp
# Opt level: O0

Real __thiscall
amrex::LineDistFcnElement2d::cpdist(LineDistFcnElement2d *this,RealVect pt,RealVect *cpmin)

{
  size_type sVar1;
  undefined8 *in_RSI;
  long in_RDI;
  int N;
  int i;
  RealVect cp;
  Real dist;
  Real mindist;
  RealVect *in_stack_00000098;
  Real in_stack_000000b8;
  LineDistFcnElement2d *in_stack_000000c0;
  undefined1 in_stack_000000d0 [24];
  RealVect *in_stack_ffffffffffffff70;
  int local_3c;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  double local_20;
  double local_18;
  
  local_18 = 1e+29;
  RealVect::RealVect(in_stack_ffffffffffffff70);
  local_3c = 1;
  sVar1 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)(in_RDI + 8));
  for (; local_3c < (int)sVar1; local_3c = local_3c + 1) {
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)(in_RDI + 8),(long)(local_3c + -1));
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)(in_RDI + 8),(long)local_3c);
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x20),(long)(local_3c + -1));
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x20),(long)local_3c);
    single_seg_cpdist(in_stack_000000c0,(RealVect)in_stack_000000d0,in_stack_000000b8,pt.vect[2],
                      pt.vect[1],pt.vect[0],in_stack_00000098,(Real *)this);
    if (local_20 < local_18) {
      local_18 = local_20;
      *in_RSI = local_38;
      in_RSI[1] = local_30;
      in_RSI[2] = local_28;
    }
  }
  return local_18;
}

Assistant:

amrex::Real LineDistFcnElement2d::cpdist(amrex::RealVect pt,
                                         amrex::RealVect & cpmin) const {

  amrex::Real mindist, dist;
  mindist = 1.0e29;
  amrex::RealVect cp;

  for (int i=1, N=control_points_x.size(); i<N; ++i) {
    single_seg_cpdist(pt,
                      control_points_x[i-1], control_points_x[i],
                      control_points_y[i-1], control_points_y[i],
                      cp, dist);
    if (dist < mindist) {
      mindist = dist;
      cpmin = cp;
    }
  }
  return mindist;

}